

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SetText
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr pszSrc,size_t offset,
          size_t length,charcount_t charOffset,bool isUtf8,ULONG grfscr,ULONG lineNumber)

{
  OLECHAR OVar1;
  EncodedCharPtr puVar2;
  bool isUtf8_local;
  charcount_t charOffset_local;
  size_t length_local;
  size_t offset_local;
  EncodedCharPtr pszSrc_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  this->m_pchBase = pszSrc;
  this->m_pchLast = this->m_pchBase + length + offset;
  puVar2 = pszSrc + offset;
  this->m_pchMinTok = puVar2;
  this->m_pchMinLine = puVar2;
  this->m_currentCharacter = puVar2;
  this->m_pchPrevLine = puVar2;
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,offset - charOffset);
  if ((offset == 0) &&
     ((OVar1 = UTF8EncodingPolicyBase<false>::PeekFull
                         (&this->super_UTF8EncodingPolicyBase<false>,this->m_currentCharacter,
                          this->m_pchLast), OVar1 == L'\xfeff' || (OVar1 == L'￮')))) {
    UTF8EncodingPolicyBase<false>::ReadFull<true>
              (&this->super_UTF8EncodingPolicyBase<false>,&this->m_currentCharacter,this->m_pchLast)
    ;
  }
  this->m_line = lineNumber;
  this->m_startLine = lineNumber;
  this->m_pchStartLine = this->m_currentCharacter;
  this->m_ptoken->tk = tkNone;
  this->field_0x508 = this->field_0x508 & 0xfe | (grfscr & 0x2000) != 0;
  this->m_fHadEol = 0;
  this->field_0x508 = this->field_0x508 & 0x3f;
  UTF8EncodingPolicyBase<false>::SetIsUtf8(&this->super_UTF8EncodingPolicyBase<false>,isUtf8);
  return;
}

Assistant:

void Scanner<EncodingPolicy>::SetText(EncodedCharPtr pszSrc, size_t offset, size_t length, charcount_t charOffset, bool isUtf8, ULONG grfscr, ULONG lineNumber)
{
    // Save the start of the script and add the offset to get the point where we should start scanning.
    m_pchBase = pszSrc;
    m_pchLast = m_pchBase + offset + length;
    m_pchPrevLine = m_currentCharacter = m_pchMinLine = m_pchMinTok = pszSrc + offset;

    this->RestoreMultiUnits(offset - charOffset);

    // Absorb any byte order mark at the start
    if(offset == 0)
    {
        switch( this->PeekFull(m_currentCharacter, m_pchLast) )
        {
        case 0xFFEE:    // "Opposite" endian BOM
            // We do not support big-endian encodings
            // fall-through

        case 0xFEFF:    // "Correct" BOM
            this->template ReadFull<true>(m_currentCharacter, m_pchLast);
            break;
        }
    }

    m_line = lineNumber;
    m_startLine = lineNumber;
    m_pchStartLine = m_currentCharacter;
    m_ptoken->tk = tkNone;
    m_fIsModuleCode = (grfscr & fscrIsModuleCode) != 0;
    m_fHadEol = FALSE;
    m_DeferredParseFlags = ScanFlagNone;

    this->SetIsUtf8(isUtf8);
}